

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Skip(TestInfo *this)

{
  TestEventListeners *this_00;
  TestEventListener *pTVar1;
  TestPartResult *this_01;
  TestInfo *in_RDI;
  TestPartResult test_part_result;
  TestEventListener *repeater;
  UnitTest *in_stack_ffffffffffffff70;
  undefined1 local_80 [32];
  char *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  TestPartResult *in_stack_ffffffffffffffc0;
  
  if ((in_RDI->should_run_ & 1U) != 0) {
    UnitTest::GetInstance();
    UnitTest::set_current_test_info(in_stack_ffffffffffffff70,in_RDI);
    UnitTest::GetInstance();
    this_00 = UnitTest::listeners((UnitTest *)0x17ac09);
    pTVar1 = TestEventListeners::repeater(this_00);
    (*pTVar1->_vptr_TestEventListener[8])(pTVar1,in_RDI);
    file((TestInfo *)0x17ac39);
    line(in_RDI);
    TestPartResult::TestPartResult
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    internal::GetUnitTestImpl();
    this_01 = (TestPartResult *)
              internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread
                        ((UnitTestImpl *)0x17ac7b);
    (*(*(_func_int ***)this_01)[2])(this_01,local_80);
    (*pTVar1->_vptr_TestEventListener[0xb])(pTVar1,in_RDI);
    UnitTest::GetInstance();
    UnitTest::set_current_test_info(in_stack_ffffffffffffff70,in_RDI);
    TestPartResult::~TestPartResult(this_01);
  }
  return;
}

Assistant:

void TestInfo::Skip() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TestPartResult test_part_result =
      TestPartResult(TestPartResult::kSkip, this->file(), this->line(), "");
  internal::GetUnitTestImpl()
      ->GetTestPartResultReporterForCurrentThread()
      ->ReportTestPartResult(test_part_result);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);
  UnitTest::GetInstance()->set_current_test_info(nullptr);
}